

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall wallet::CWallet::SetWalletFlag(CWallet *this,uint64_t flags)

{
  bool bVar1;
  WalletDatabase *pWVar2;
  runtime_error *this_00;
  long in_FS_OFFSET;
  allocator<char> local_71;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock33,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x6a9,false);
  LOCK();
  (this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i =
       (this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i | flags;
  UNLOCK();
  pWVar2 = GetDatabase(this);
  (*pWVar2->_vptr_WalletDatabase[0xe])(&local_40,pWVar2,1);
  local_40._M_string_length = (size_type)pWVar2;
  bVar1 = WalletBatch::WriteWalletFlags
                    ((WalletBatch *)&local_40,
                     (this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i);
  if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_40._M_dataplus._M_p + 0x28))();
  }
  if (bVar1) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock33.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"SetWalletFlag",&local_71);
    std::operator+(&local_40,&local_60,": writing wallet flags failed");
    std::runtime_error::runtime_error(this_00,(string *)&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::SetWalletFlag(uint64_t flags)
{
    LOCK(cs_wallet);
    m_wallet_flags |= flags;
    if (!WalletBatch(GetDatabase()).WriteWalletFlags(m_wallet_flags))
        throw std::runtime_error(std::string(__func__) + ": writing wallet flags failed");
}